

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterCloseDocCallback(void *context)

{
  int val;
  int rc;
  xmlParserCtxtPtr ctxt;
  void *context_local;
  
  val = xmlParseChunk((xmlParserCtxtPtr)context,(char *)0x0,0,1);
  if (val == 0) {
    context_local._4_4_ = 0;
  }
  else {
    xmlWriterErrMsgInt((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                       "xmlTextWriterCloseDocCallback : XML error %d !\n",val);
    context_local._4_4_ = -1;
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlTextWriterCloseDocCallback(void *context)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) context;
    int rc;

    if ((rc = xmlParseChunk(ctxt, NULL, 0, 1)) != 0) {
        xmlWriterErrMsgInt(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterCloseDocCallback : XML error %d !\n",
                        rc);
        return -1;
    }

    return 0;
}